

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O2

void __thiscall
helics::BrokerApp::BrokerApp
          (BrokerApp *this,CoreType ctype,string_view brokerName,string_view argString)

{
  undefined8 this_00;
  ParseOutput PVar1;
  allocator<char> local_71;
  undefined1 local_70 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  local_70._16_8_ = argString._M_str;
  local_70._8_8_ = argString._M_len;
  local_38._M_str = brokerName._M_str;
  local_38._M_len = brokerName._M_len;
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->broker).super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->name,&local_38,(allocator<char> *)(local_70 + 0x18));
  generateParser((BrokerApp *)local_70,SUB81(this,0));
  this_00 = local_70._0_8_;
  *(CoreType *)(local_70._0_8_ + 0x398) = ctype;
  *(bool *)(local_70._0_8_ + 0x361) = true;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(local_70 + 0x18),
             (basic_string_view<char,_std::char_traits<char>_> *)(local_70 + 8),&local_71);
  PVar1 = helicsCLI11App::helics_parse<std::__cxx11::string>
                    ((helicsCLI11App *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_70 + 0x18));
  std::__cxx11::string::~string((string *)(local_70 + 0x18));
  if (PVar1 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)local_70);
  }
  if ((tuple<helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>)local_70._0_8_
      != (_Head_base<0UL,_helics::helicsCLI11App_*,_false>)0x0) {
    (**(code **)(*(long *)local_70._0_8_ + 8))();
  }
  return;
}

Assistant:

BrokerApp::BrokerApp(CoreType ctype, std::string_view brokerName, std::string_view argString):
    name(brokerName)
{
    auto app = generateParser(ctype == CoreType::MULTI);
    app->setDefaultCoreType(ctype);
    app->passConfig = true;
    if (app->helics_parse(std::string(argString)) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}